

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
__thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
static_resources::
create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::filter_expression>
          (static_resources *this,filter_expression *val)

{
  pointer ppeVar1;
  pointer ptVar2;
  bool bVar3;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *peVar4;
  pointer __p;
  pointer *__ptr;
  __single_object temp;
  filter_expression *local_28;
  _Head_base<0UL,_jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  local_20;
  
  peVar4 = (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            *)operator_new(0x48);
  (peVar4->
  super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>).
  _vptr_expr_base = (_func_int **)&PTR__expr_base_00b5f6d0;
  peVar4->precedence_level_ = (val->super_projection_base).super_expression_type.precedence_level_;
  bVar3 = (val->super_projection_base).super_expression_type.is_projection_;
  peVar4->is_right_associative_ =
       (val->super_projection_base).super_expression_type.is_right_associative_;
  peVar4->is_projection_ = bVar3;
  (peVar4->
  super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>).
  _vptr_expr_base = (_func_int **)&PTR__projection_base_00b5f6a0;
  ppeVar1 = (val->super_projection_base).expressions_.
            super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  peVar4[1].
  super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>.
  _vptr_expr_base =
       (_func_int **)
       (val->super_projection_base).expressions_.
       super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  peVar4[1].precedence_level_ = (size_t)ppeVar1;
  *(pointer *)&peVar4[1].is_right_associative_ =
       (val->super_projection_base).expressions_.
       super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (val->super_projection_base).expressions_.
  super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (val->super_projection_base).expressions_.
  super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (val->super_projection_base).expressions_.
  super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (peVar4->
  super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>).
  _vptr_expr_base = (_func_int **)&PTR__filter_expression_00b5f618;
  ptVar2 = (val->token_list_).
           super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  peVar4[2].
  super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>.
  _vptr_expr_base =
       (_func_int **)
       (val->token_list_).
       super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  peVar4[2].precedence_level_ = (size_t)ptVar2;
  *(pointer *)&peVar4[2].is_right_associative_ =
       (val->token_list_).
       super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (val->token_list_).
  super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (val->token_list_).
  super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (val->token_list_).
  super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = (filter_expression *)0x0;
  local_20._M_head_impl =
       (expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)
       peVar4;
  std::
  vector<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((vector<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
              *)(this + 0x38),
             (unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)&local_20);
  if ((expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
      )local_20._M_head_impl !=
      (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
      )0x0) {
    (*((expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)
      &(local_20._M_head_impl)->_vptr_expr_base)->_vptr_expr_base[1])();
  }
  if (local_28 != (filter_expression *)0x0) {
    std::
    default_delete<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::filter_expression>
    ::operator()((default_delete<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::filter_expression>
                  *)&local_28,local_28);
  }
  return peVar4;
}

Assistant:

expr_base_impl<Json>* create_expression(T&& val)
            {
                auto temp = jsoncons::make_unique<T>(std::forward<T>(val));
                expr_base_impl<Json>* ptr = temp.get();
                expr_storage_.push_back(std::move(temp));
                return ptr;
            }